

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

size_t ZSTD_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  U16 UVar1;
  U16 UVar2;
  uint uVar3;
  U32 UVar4;
  U32 UVar5;
  size_t sVar6;
  size_t sVar7;
  size_t diff_1;
  size_t diff;
  BYTE *pInLoopLimit;
  BYTE *pStart;
  BYTE *pInLimit_local;
  BYTE *pMatch_local;
  BYTE *pIn_local;
  
  pInLimit_local = pMatch;
  pMatch_local = pIn;
  if (pIn < pInLimit + -7) {
    sVar6 = MEM_readST(pMatch);
    sVar7 = MEM_readST(pIn);
    if ((sVar6 ^ sVar7) != 0) {
      uVar3 = ZSTD_NbCommonBytes(sVar6 ^ sVar7);
      return (ulong)uVar3;
    }
    pInLimit_local = pMatch + 8;
    for (pMatch_local = pIn + 8; pMatch_local < pInLimit + -7; pMatch_local = pMatch_local + 8) {
      sVar6 = MEM_readST(pInLimit_local);
      sVar7 = MEM_readST(pMatch_local);
      if ((sVar6 ^ sVar7) != 0) {
        uVar3 = ZSTD_NbCommonBytes(sVar6 ^ sVar7);
        return (size_t)(pMatch_local + ((ulong)uVar3 - (long)pIn));
      }
      pInLimit_local = pInLimit_local + 8;
    }
  }
  uVar3 = MEM_64bits();
  if ((uVar3 != 0) && (pMatch_local < pInLimit + -3)) {
    UVar4 = MEM_read32(pInLimit_local);
    UVar5 = MEM_read32(pMatch_local);
    if (UVar4 == UVar5) {
      pMatch_local = pMatch_local + 4;
      pInLimit_local = pInLimit_local + 4;
    }
  }
  if (pMatch_local < pInLimit + -1) {
    UVar1 = MEM_read16(pInLimit_local);
    UVar2 = MEM_read16(pMatch_local);
    if (UVar1 == UVar2) {
      pMatch_local = pMatch_local + 2;
      pInLimit_local = pInLimit_local + 2;
    }
  }
  if ((pMatch_local < pInLimit) && (*pInLimit_local == *pMatch_local)) {
    pMatch_local = pMatch_local + 1;
  }
  return (size_t)(pMatch_local + -(long)pIn);
}

Assistant:

MEM_STATIC size_t ZSTD_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* const pInLimit)
{
    const BYTE* const pStart = pIn;
    const BYTE* const pInLoopLimit = pInLimit - (sizeof(size_t)-1);

    if (pIn < pInLoopLimit) {
        { size_t const diff = MEM_readST(pMatch) ^ MEM_readST(pIn);
          if (diff) return ZSTD_NbCommonBytes(diff); }
        pIn+=sizeof(size_t); pMatch+=sizeof(size_t);
        while (pIn < pInLoopLimit) {
            size_t const diff = MEM_readST(pMatch) ^ MEM_readST(pIn);
            if (!diff) { pIn+=sizeof(size_t); pMatch+=sizeof(size_t); continue; }
            pIn += ZSTD_NbCommonBytes(diff);
            return (size_t)(pIn - pStart);
    }   }
    if (MEM_64bits() && (pIn<(pInLimit-3)) && (MEM_read32(pMatch) == MEM_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (MEM_read16(pMatch) == MEM_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (size_t)(pIn - pStart);
}